

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O3

void __thiscall
PathTracer::clear_target_images(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  enable_shared_from_this<myvk::Base> *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkImageMemoryBarrier> __l_00;
  allocator_type local_169;
  VkClearColorValue local_168;
  long local_158;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_138;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_118;
  shared_ptr<myvk::Fence> fence;
  VkImageMemoryBarrier local_f0;
  VkImageMemoryBarrier local_a8;
  VkImageMemoryBarrier local_60;
  
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::Fence::Create((Fence *)&fence,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),0);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar2 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_158 = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_8_ = 0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            (&local_f0,
             &((this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_a8,
             &((this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_60,
             &((this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  __l._M_len = 3;
  __l._M_array = &local_f0;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_118,__l,&local_169);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar2,1,0x1000,(vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168
             ,&local_138,&local_118);
  if (local_118.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_168._0_8_ != (void *)0x0) {
    operator_delete((void *)local_168._0_8_,local_158 - local_168._0_8_);
  }
  local_f0._0_8_ =
       (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0.pNext =
       (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_168._0_8_ = 0;
  local_168._8_8_ = 0;
  myvk::CommandBuffer::CmdClearColorImage
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Ptr<ImageBase> *)&local_f0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.pNext);
  }
  local_f0._0_8_ =
       (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0.pNext =
       (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_168._0_8_ = 0;
  local_168._8_8_ = 0;
  myvk::CommandBuffer::CmdClearColorImage
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Ptr<ImageBase> *)&local_f0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.pNext);
  }
  local_f0._0_8_ =
       (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0.pNext =
       (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(((element_type *)local_f0.pNext)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_168._0_8_ = 0;
  local_168._8_8_ = 0;
  myvk::CommandBuffer::CmdClearColorImage
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Ptr<ImageBase> *)&local_f0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,&local_168);
  if ((element_type *)local_f0.pNext != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0.pNext);
  }
  peVar2 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_158 = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_8_ = 0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetMemoryBarrier
            (&local_f0,
             &((this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_a8,
             &((this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetMemoryBarrier
            (&local_60,
             &((this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,1,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,0xffffffff,0xffffffff);
  __l_00._M_len = 3;
  __l_00._M_array = &local_f0;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_118,__l_00,&local_169);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar2,0x1000,0x2000,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_168,&local_138,
             &local_118);
  if (local_118.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_168._0_8_ != (void *)0x0) {
    operator_delete((void *)local_168._0_8_,local_158 - local_168._0_8_);
  }
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void PathTracer::clear_target_images(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                     VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                                      VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});

	command_buffer->CmdClearColorImage(m_color_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_albedo_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdClearColorImage(m_normal_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);

	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {m_color_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                     VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_albedo_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL),
	     m_normal_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL)});
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}